

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_i4rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  int iVar1;
  size_t __nmemb;
  fitsfile *pfVar2;
  int iVar3;
  void *__ptr;
  size_t sVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  int nullvalue;
  double local_60;
  fitsfile *local_58;
  fitsfile *local_50;
  int *local_48;
  long local_40;
  int tstatus;
  int anynul;
  
  __nmemb = *naxes;
  lVar6 = 1;
  if (1 < naxis) {
    lVar5 = 1;
    do {
      lVar6 = lVar6 * naxes[lVar5];
      lVar5 = lVar5 + 1;
    } while (naxis != lVar5);
  }
  local_60 = rescale;
  local_58 = infptr;
  local_50 = outfptr;
  __ptr = calloc(__nmemb,4);
  pfVar2 = local_58;
  if (__ptr == (void *)0x0) {
    *status = 0x71;
    iVar3 = 0x71;
  }
  else {
    tstatus = 0;
    ffgky(local_58,0x1f,"BLANK",&nullvalue,0,&tstatus);
    iVar3 = tstatus;
    ffpscl(0x3ff0000000000000,0,pfVar2,status);
    ffpscl(0x3ff0000000000000,0,local_50,status);
    local_40 = lVar6;
    if (0 < lVar6) {
      lVar6 = 1;
      lVar5 = 0;
      local_48 = status;
      do {
        ffgpvk(local_58,1,lVar6,__nmemb,0,__ptr,&anynul,status);
        status = local_48;
        if (iVar3 == 0) {
          if (0 < (long)__nmemb) {
            sVar4 = 0;
            do {
              iVar1 = *(int *)((long)__ptr + sVar4 * 4);
              if (iVar1 != nullvalue) {
                dVar7 = (double)iVar1 / local_60;
                *(int *)((long)__ptr + sVar4 * 4) =
                     (int)(dVar7 + *(double *)(&DAT_0010b4e0 + (ulong)(dVar7 < 0.0) * 8));
              }
              sVar4 = sVar4 + 1;
            } while (__nmemb != sVar4);
          }
        }
        else if (0 < (long)__nmemb) {
          sVar4 = 0;
          do {
            dVar7 = (double)*(int *)((long)__ptr + sVar4 * 4) / local_60;
            *(int *)((long)__ptr + sVar4 * 4) =
                 (int)(dVar7 + *(double *)(&DAT_0010b4e0 + (ulong)(dVar7 < 0.0) * 8));
            sVar4 = sVar4 + 1;
          } while (__nmemb != sVar4);
        }
        ffpprk(local_50,1,lVar6,__nmemb,__ptr,local_48);
        lVar6 = lVar6 + __nmemb;
        lVar5 = lVar5 + 1;
      } while (lVar5 != local_40);
    }
    free(__ptr);
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int fp_i4rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	int *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(int));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TINT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_int(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_int(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}